

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

void __thiscall
testing::internal::
CartesianProductGenerator<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_aom_superblock_size,_aom_rc_mode>
::IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL,_3UL>_>::Advance
          (IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL,_3UL>_> *this)

{
  (**(code **)(*(long *)(this->current_).
                        super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<aom_superblock_size>,_testing::internal::ParamIterator<aom_rc_mode>_>
                        .
                        super__Tuple_impl<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<aom_superblock_size>,_testing::internal::ParamIterator<aom_rc_mode>_>
                        .
                        super__Tuple_impl<2UL,_testing::internal::ParamIterator<aom_superblock_size>,_testing::internal::ParamIterator<aom_rc_mode>_>
                        .super__Tuple_impl<3UL,_testing::internal::ParamIterator<aom_rc_mode>_>.
                        super__Head_base<3UL,_testing::internal::ParamIterator<aom_rc_mode>,_false>.
                        _M_head_impl.impl_ + 0x18))();
  CartesianProductGenerator<libaom_test::CodecFactory_const*,libaom_test::TestMode,aom_superblock_size,aom_rc_mode>
  ::IteratorImpl<testing::internal::IndexSequence<0ul,1ul,2ul,3ul>>::AdvanceIfEnd<3ul>
            ((IteratorImpl<testing::internal::IndexSequence<0ul,1ul,2ul,3ul>> *)this);
  ComputeCurrentValue(this);
  return;
}

Assistant:

void Advance() override {
      assert(!AtEnd());
      // Advance the last iterator.
      ++std::get<sizeof...(T) - 1>(current_);
      // if that reaches end, propagate that up.
      AdvanceIfEnd<sizeof...(T) - 1>();
      ComputeCurrentValue();
    }